

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int bxor(lua_State *L)

{
  StkId pTVar1;
  UB UVar2;
  UB UVar3;
  int idx;
  ulong uVar4;
  
  UVar2 = barg(L,1);
  uVar4 = (ulong)((long)L->top - (long)L->base) >> 4;
  while (idx = (int)uVar4, 1 < idx) {
    UVar3 = barg(L,idx);
    UVar2 = UVar2 ^ UVar3;
    uVar4 = (ulong)(idx - 1);
  }
  pTVar1 = L->top;
  (pTVar1->value).n = (double)(int)UVar2;
  pTVar1->tt = 3;
  L->top = L->top + 1;
  return 1;
}

Assistant:

static int bxor(lua_State*L){
int i;UB b=barg(L,1);for(i=lua_gettop(L);i>1;i--)b^=barg(L,i);BRET(b)}